

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagBuilder.cpp
# Opt level: O1

void __thiscall Mond::DiagBuilder::WriteUntilFormatter(DiagBuilder *this,char expect)

{
  char *pcVar1;
  int iVar2;
  logic_error *this_00;
  long lVar3;
  
  iVar2 = this->m_pos;
  lVar3 = 0;
  do {
    this->m_pos = iVar2 + 1 + (int)lVar3;
    pcVar1 = this->m_fmt + iVar2 + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pcVar1 != '%');
  std::ostream::write(&this->field_0x60,(long)(this->m_fmt + iVar2));
  iVar2 = this->m_pos;
  this->m_pos = iVar2 + 1;
  if (this->m_fmt[iVar2] == expect) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"invalid diagnostic format string");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DiagBuilder::WriteUntilFormatter(char expect)
{
	auto beg = m_pos;

	while (m_fmt[m_pos++] != '%')
	{
	}

	m_msg.write(&m_fmt[beg], m_pos - beg - 1);

	if (m_fmt[m_pos++] != expect)
	{
		throw logic_error("invalid diagnostic format string");
	}
}